

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom,bool decode)

{
  bool bVar1;
  string local_280;
  RegularExpression urlRe;
  
  RegularExpression::RegularExpression(&urlRe,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find(&urlRe,URL);
  if (bVar1) {
    RegularExpressionMatch::match_abi_cxx11_(&local_280,&urlRe.regmatch,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    RegularExpressionMatch::match_abi_cxx11_(&local_280,&urlRe.regmatch,2);
    std::__cxx11::string::operator=((string *)dataglom,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    if (decode) {
      DecodeURL(&local_280,dataglom);
      std::__cxx11::string::operator=((string *)dataglom,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
  }
  RegularExpression::~RegularExpression(&urlRe);
  return bVar1;
}

Assistant:

bool SystemTools::ParseURLProtocol(const std::string& URL,
                                   std::string& protocol,
                                   std::string& dataglom, bool decode)
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe(VTK_URL_PROTOCOL_REGEX);

  if (!urlRe.find(URL))
    return false;

  protocol = urlRe.match(1);
  dataglom = urlRe.match(2);

  if (decode) {
    dataglom = DecodeURL(dataglom);
  }

  return true;
}